

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall
QFileDialogPrivate::fileRenamed
          (QFileDialogPrivate *this,QString *path,QString *oldName,QString *newName)

{
  bool bVar1;
  FileMode FVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar2 = QFileDialog::fileMode
                    (*(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8);
  if (FVar2 == Directory) {
    rootPath((QString *)&local_50,this);
    bVar1 = ::comparesEqual(path,(QString *)&local_50);
    if (bVar1) {
      QLineEdit::text((QString *)&QStack_68,
                      &((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
      bVar1 = ::comparesEqual((QString *)&QStack_68,oldName);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if (bVar1) {
        QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,newName);
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::fileRenamed(const QString &path, const QString &oldName, const QString &newName)
{
    const QFileDialog::FileMode fileMode = q_func()->fileMode();
    if (fileMode == QFileDialog::Directory) {
        if (path == rootPath() && lineEdit()->text() == oldName)
            lineEdit()->setText(newName);
    }
}